

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

string_view __thiscall inja::Lexer::clear_final_line_if_whitespace(Lexer *this,string_view text)

{
  byte bVar1;
  Lexer *pLVar2;
  int iVar3;
  string_view sVar4;
  
  pLVar2 = this;
  do {
    if (pLVar2 == (Lexer *)0x0) goto LAB_0010dc5e;
    bVar1 = ((char *)text._M_len + -1)[(long)pLVar2];
    iVar3 = 3;
    if (bVar1 < 0xd) {
      if (bVar1 == 9) {
LAB_0010dc49:
        pLVar2 = (Lexer *)((long)&pLVar2[-1].m_pos + 7);
        iVar3 = 0;
      }
      else if (bVar1 != 10) {
LAB_0010dc50:
        iVar3 = 1;
      }
    }
    else if (bVar1 != 0xd) {
      if (bVar1 != 0x20) goto LAB_0010dc50;
      goto LAB_0010dc49;
    }
  } while (iVar3 == 0);
  if (iVar3 == 3) {
LAB_0010dc5e:
    this = pLVar2;
  }
  sVar4._M_str = (char *)text._M_len;
  sVar4._M_len = (size_t)this;
  return sVar4;
}

Assistant:

static nonstd::string_view clear_final_line_if_whitespace(nonstd::string_view text)
  {
    nonstd::string_view result = text;
    while (!result.empty()) {
      char ch = result.back();
      if (ch == ' ' || ch == '\t')
       result.remove_suffix(1);
      else if (ch == '\n' || ch == '\r')
        break;
      else
        return text;
    }
    return result;
  }